

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_tim_sort_merge_right
               (int64_t *A_src,int64_t *B_src,size_t A,size_t B,int64_t *storage,int *min_gallop_p)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  long in_RCX;
  int iVar5;
  long in_RDX;
  void *in_RSI;
  int64_t *in_RDI;
  int64_t *in_R8;
  int *in_R9;
  int64_t *dst;
  int min_gallop;
  int b_count;
  int a_count;
  int pb;
  int pa;
  int pdst;
  size_t k;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  
  local_50 = *in_R9;
  iVar2 = (int)in_RDX;
  local_44 = (int)in_RCX + -1;
  iVar5 = iVar2 + (int)in_RCX;
  memcpy(in_R8,in_RSI,in_RCX << 3);
  local_40 = iVar2 + -2;
  local_3c = iVar5 + -2;
  in_RDI[iVar5 + -1] = in_RDI[iVar2 + -1];
  if (in_RDX == 1) {
LAB_0011a789:
    memcpy(in_RDI,in_R8,(long)(local_44 + 1) << 3);
    *in_R9 = local_50;
    return;
  }
  do {
    local_4c = 0;
    local_48 = 0;
    while( true ) {
      if (in_RDI[local_40] - in_R8[local_44] < 1) {
        in_RDI[local_3c] = in_R8[local_44];
        local_4c = local_4c + 1;
        local_48 = 0;
        local_44 = local_44 + -1;
        iVar2 = local_4c;
      }
      else {
        iVar5 = local_40 + -1;
        in_RDI[local_3c] = in_RDI[local_40];
        local_48 = local_48 + 1;
        local_4c = 0;
        local_40 = iVar5;
        iVar2 = local_48;
        if (iVar5 == -1) goto LAB_0011a789;
      }
      if (local_50 <= iVar2) break;
      local_3c = local_3c + -1;
    }
    local_50 = local_50 + 1;
    do {
      if (local_50 != 0) {
        local_50 = local_50 + -1;
      }
      sVar3 = sorter_tim_sort_gallop(in_RDI,(long)(local_40 + 1),in_R8[local_44],(long)local_40,1);
      memmove(in_RDI + (long)local_44 + sVar3 + 1,in_RDI + sVar3,((long)(local_40 + 1) - sVar3) * 8)
      ;
      iVar5 = (int)sVar3;
      local_3c = local_44 + iVar5;
      iVar2 = iVar5 + -1;
      if (iVar2 == -1) goto LAB_0011a789;
      in_RDI[local_3c] = in_R8[local_44];
      if ((local_48 != 0) && (iVar1 = local_44 + -1, local_40 = iVar2, (long)iVar5 - sVar3 < 7))
      break;
      sVar3 = sorter_tim_sort_gallop(in_R8,(long)local_44,in_RDI[iVar2],(long)(local_44 + -1),0);
      memcpy(in_RDI + (long)iVar2 + sVar3 + 1,in_R8 + sVar3,((long)local_44 - sVar3) * 8);
      iVar4 = (int)sVar3;
      local_3c = iVar2 + iVar4;
      local_44 = iVar4 + -1;
      local_40 = iVar5 + -2;
      in_RDI[local_3c] = in_RDI[iVar2];
      if (local_40 == -1) goto LAB_0011a789;
    } while ((local_4c == 0) || (iVar1 = local_44, 6 < (long)iVar4 - sVar3));
    local_44 = iVar1;
    local_3c = local_3c + -1;
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

static void TIM_SORT_MERGE_RIGHT(SORT_TYPE *A_src, SORT_TYPE *B_src,
                                 const size_t A, const size_t B,
                                 SORT_TYPE *storage, int *min_gallop_p) {
  size_t k;
  int pdst, pa, pb, a_count, b_count;
  int min_gallop = *min_gallop_p;
  SORT_TYPE *dst = A_src;
  pa = (int)(A - 1);
  pb = (int)(B - 1);
  pdst = (int)(A + B - 1);
  SORT_TYPE_CPY(storage, B_src, B);
  B_src = storage;
  /* last element must in A, otherwise skipped in the caller  */
  dst[pdst--] = A_src[pa--];

  if (A == 1) {
    goto copyB;
  }

  for (;;) {
    a_count = b_count = 0;

    for (;;) {
      if (SORT_CMP(A_src[pa], B_src[pb]) <= 0) {
        dst[pdst--] = B_src[pb--];
        ++b_count;
        a_count = 0;

        if (min_gallop <= b_count) {
          break;
        }

        /* No need to check if pb == -1 because the first element must be in B
         * so pa will reach to -1 first. You can check pb == 0 and do
         * some optimization if you wish.*/
      } else {
        dst[pdst--] = A_src[pa--];
        ++a_count;
        b_count = 0;

        if (pa == -1) {
          goto copyB;
        }

        if (min_gallop <= a_count) {
          break;
        }
      }
    }

    ++min_gallop;

    for (;;) {
      if (min_gallop != 0) {
        min_gallop--;
      }

      k = TIM_SORT_GALLOP(A_src, pa + 1, B_src[pb], pa, 1);
      /* Understand the margin by considering k==0 */
      SORT_TYPE_MOVE(&dst[pb + k + 1], &A_src[k], pa + 1 - k);
      pdst = pb + (int)k;
      pa = (int)(k - 1);

      if (pa == -1) {
        goto copyB;
      }

      /* now we know the next must be in B */
      dst[pdst--] = B_src[pb--];

      if (a_count && pa + 1 - k < TIM_SORT_MIN_GALLOP) {
        ++min_gallop;
        break;
      }

      k = TIM_SORT_GALLOP(B_src, pb + 1, A_src[pa], pb, 0);
      SORT_TYPE_CPY(&dst[pa + k + 1], &B_src[k], pb + 1 - k);
      pdst = pa + (int)k;
      pb = (int)(k - 1);
      dst[pdst--] = A_src[pa--];

      if (pa == -1) {
        goto copyB;
      }

      if (b_count && pb + 1 - k < TIM_SORT_MIN_GALLOP) {
        ++min_gallop;
        break;
      }
    }
  }

copyB:
  SORT_TYPE_CPY(dst, B_src, pb + 1);
  *min_gallop_p = min_gallop;
  return;
}